

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::build(TypedConfigurations *this,Configurations *configurations)

{
  ConfigurationType CVar1;
  Level LVar2;
  Level level;
  pointer pcVar3;
  long lVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  unsigned_long uVar7;
  long *plVar8;
  undefined4 extraout_var_02;
  undefined8 uVar9;
  TypedConfigurations *pTVar10;
  _Alloc_hider _Var11;
  Configuration **ppCVar12;
  bool bVar13;
  vector<el::Configuration_*,_std::allocator<el::Configuration_*>_> withFileSizeLimit;
  Configuration *conf;
  Configuration **local_258;
  iterator iStack_250;
  Configuration **local_248;
  TypedConfigurations *local_240;
  Configuration *local_238;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [32];
  undefined1 local_190 [32];
  undefined1 local_170 [32];
  undefined1 local_150 [32];
  _Base_ptr local_130;
  _Base_ptr local_128;
  _Base_ptr local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  _Base_ptr local_d8;
  code *pcStack_d0;
  _Base_ptr p_Var6;
  undefined4 extraout_var_01;
  
  (*(this->super_ThreadSafe)._vptr_ThreadSafe[2])();
  local_258 = (Configuration **)0x0;
  iStack_250._M_current = (Configuration **)0x0;
  local_248 = (Configuration **)0x0;
  iVar5 = (*(configurations->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
            ).
            super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
            .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
  p_Var6 = (_Base_ptr)CONCAT44(extraout_var,iVar5);
  local_118 = (_Base_ptr)&this->m_maxLogFileSizeMap;
  local_120 = (_Base_ptr)&this->m_performanceTrackingMap;
  local_128 = (_Base_ptr)&this->m_subsecondPrecisionMap;
  local_f8 = (_Base_ptr)&this->m_logFormatMap;
  local_130 = (_Base_ptr)&this->m_logFlushThresholdMap;
  local_100 = (_Base_ptr)&this->m_toStandardOutputMap;
  local_108 = (_Base_ptr)&this->m_toFileMap;
  local_110 = (_Base_ptr)&this->m_enabledMap;
  local_240 = this;
  do {
    iVar5 = (*(configurations->
              super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
              super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
              .super_ThreadSafe._vptr_ThreadSafe[6])(configurations);
    if (p_Var6 == (_Base_ptr)CONCAT44(extraout_var_00,iVar5)) {
      iVar5 = (*(configurations->
                super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                .super_ThreadSafe._vptr_ThreadSafe[5])(configurations);
      for (plVar8 = (long *)CONCAT44(extraout_var_01,iVar5);
          iVar5 = (*(configurations->
                    super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
                    super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                    .super_ThreadSafe._vptr_ThreadSafe[6])(configurations),
          plVar8 != (long *)CONCAT44(extraout_var_02,iVar5); plVar8 = plVar8 + 1) {
        lVar4 = *plVar8;
        if (*(int *)(lVar4 + 0xc) == 0x10) {
          insertFile(this,*(Level *)(lVar4 + 8),(string *)(lVar4 + 0x10));
        }
      }
      if (local_258 != iStack_250._M_current) {
        ppCVar12 = local_258;
        do {
          uStack_e0 = (_Base_ptr)0x0;
          local_e8 = defaultPreRollOutCallback;
          pcStack_d0 = utils::std::
                       _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                       ::_M_invoke;
          local_d8 = (_Base_ptr)
                     utils::std::
                     _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
                     ::_M_manager;
          unsafeValidateFileRolling(this,(*ppCVar12)->m_level,(PreRollOutCallback *)&local_e8);
          if (local_d8 != (_Base_ptr)0x0) {
            (*(code *)local_d8)((PreRollOutCallback *)&local_e8,(PreRollOutCallback *)&local_e8,3);
          }
          ppCVar12 = ppCVar12 + 1;
        } while (ppCVar12 != iStack_250._M_current);
      }
      if (local_258 != (Configuration **)0x0) {
        operator_delete(local_258,(long)local_248 - (long)local_258);
      }
      return;
    }
    local_238 = *(Configuration **)p_Var6;
    CVar1 = local_238->m_configurationType;
    if ((int)CVar1 < 0x20) {
      switch(CVar1) {
      case Enabled:
        LVar2 = local_238->m_level;
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        pcVar3 = (local_238->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d0,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
        utils::Str::rtrim(&local_1d0);
        utils::Str::ltrim(&local_1d0);
        iVar5 = std::__cxx11::string::compare((char *)&local_1d0);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1d0), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_1d0);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(local_240,LVar2,(bool *)&local_e8,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_110,true);
        this = local_240;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          this = local_240;
        }
        break;
      case ToFile:
        LVar2 = local_238->m_level;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        pcVar3 = (local_238->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
        utils::Str::rtrim(&local_1f0);
        utils::Str::ltrim(&local_1f0);
        iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_1f0), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_1f0);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(this,LVar2,(bool *)&local_e8,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_108,true);
        uVar9 = local_1f0.field_2._M_allocated_capacity;
        _Var11._M_p = local_1f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_0015df53:
          operator_delete(_Var11._M_p,
                          (ulong)((long)&(((Configurations *)uVar9)->
                                         super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
                                         ).
                                         super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                                         .super_ThreadSafe._vptr_ThreadSafe + 1));
        }
        break;
      case ToStandardOutput:
        LVar2 = local_238->m_level;
        local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
        pcVar3 = (local_238->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
        utils::Str::rtrim(&local_210);
        utils::Str::ltrim(&local_210);
        iVar5 = std::__cxx11::string::compare((char *)&local_210);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_210), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_210);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(this,LVar2,(bool *)&local_e8,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_100,true);
        uVar9 = local_210.field_2._M_allocated_capacity;
        _Var11._M_p = local_210._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) goto LAB_0015df53;
        break;
      case Format:
        LVar2 = local_238->m_level;
        level = local_238->m_level;
        pcVar3 = (local_238->m_value)._M_dataplus._M_p;
        local_150._0_8_ = local_150 + 0x10;
        local_f0 = p_Var6;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  ((string *)local_150,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
        LogFormat::LogFormat((LogFormat *)&local_e8,level,(string_t *)local_150);
        setValue<el::base::LogFormat>
                  (this,LVar2,(LogFormat *)&local_e8,
                   (map<el::Level,_el::base::LogFormat,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::LogFormat>_>_>
                    *)local_f8,true);
        LogFormat::~LogFormat((LogFormat *)&local_e8);
        p_Var6 = local_f0;
        if ((_Base_ptr)local_150._0_8_ != (_Base_ptr)(local_150 + 0x10)) {
          operator_delete((void *)local_150._0_8_,local_150._16_8_ + 1);
          p_Var6 = local_f0;
        }
      }
    }
    else if ((int)CVar1 < 0x80) {
      if (CVar1 == MillisecondsWidth) {
        local_170._0_8_ = local_170 + 0x10;
        pcVar3 = (local_238->m_value)._M_dataplus._M_p;
        pTVar10 = (TypedConfigurations *)local_170;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_170,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
        uVar7 = getULong(pTVar10,(string *)local_170);
        local_e8._0_4_ = (int)uVar7;
        if ((int)local_e8 - 7U < 0xfffffffa) {
          local_e8._0_4_ = 3;
        }
        switch((int)local_e8) {
        default:
          local_e8._4_4_ = 1000;
          break;
        case 4:
          local_e8._4_4_ = 100;
          break;
        case 5:
          local_e8._4_4_ = 10;
          break;
        case 6:
          local_e8._4_4_ = 1;
        }
        setValue<el::base::SubsecondPrecision>
                  (this,Global,(SubsecondPrecision *)&local_e8,
                   (map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                    *)local_128,true);
        uVar9 = local_170._16_8_;
        _Var11._M_p = (pointer)local_170._0_8_;
        if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) goto LAB_0015df53;
      }
      else if (CVar1 == PerformanceTracking) {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        pcVar3 = (local_238->m_value)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
        utils::Str::rtrim(&local_230);
        utils::Str::ltrim(&local_230);
        iVar5 = std::__cxx11::string::compare((char *)&local_230);
        bVar13 = true;
        if ((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)&local_230), iVar5 != 0))
        {
          iVar5 = std::__cxx11::string::compare((char *)&local_230);
          bVar13 = iVar5 == 0;
        }
        local_e8._0_1_ = bVar13;
        setValue<bool>(this,Global,(bool *)&local_e8,
                       (map<el::Level,_bool,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_bool>_>_>
                        *)local_120,true);
        uVar9 = local_230.field_2._M_allocated_capacity;
        _Var11._M_p = local_230._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_0015df53;
      }
    }
    else if (CVar1 == MaxLogFileSize) {
      LVar2 = local_238->m_level;
      local_190._0_8_ = local_190 + 0x10;
      pcVar3 = (local_238->m_value)._M_dataplus._M_p;
      pTVar10 = (TypedConfigurations *)local_190;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_190,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
      local_e8 = (code *)getULong(pTVar10,(string *)local_190);
      setValue<unsigned_long>
                (this,LVar2,(unsigned_long *)&local_e8,
                 (map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                  *)local_118,true);
      if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
        operator_delete((void *)local_190._0_8_,
                        (ulong)((long)&(((RegistryWithPred<el::Configuration,_el::Configuration::Predicate>
                                          *)local_190._16_8_)->
                                       super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
                                       ).super_ThreadSafe._vptr_ThreadSafe + 1));
      }
      if (iStack_250._M_current == local_248) {
        std::vector<el::Configuration*,std::allocator<el::Configuration*>>::
        _M_realloc_insert<el::Configuration*const&>
                  ((vector<el::Configuration*,std::allocator<el::Configuration*>> *)&local_258,
                   iStack_250,&local_238);
      }
      else {
        *iStack_250._M_current = local_238;
        iStack_250._M_current = iStack_250._M_current + 1;
      }
    }
    else if (CVar1 == LogFlushThreshold) {
      LVar2 = local_238->m_level;
      local_1b0._0_8_ = local_1b0 + 0x10;
      pcVar3 = (local_238->m_value)._M_dataplus._M_p;
      pTVar10 = (TypedConfigurations *)local_1b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b0,pcVar3,pcVar3 + (local_238->m_value)._M_string_length);
      local_e8 = (code *)getULong(pTVar10,(string *)local_1b0);
      setValue<unsigned_long>
                (this,LVar2,(unsigned_long *)&local_e8,
                 (map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
                  *)local_130,true);
      uVar9 = local_1b0._16_8_;
      _Var11._M_p = (pointer)local_1b0._0_8_;
      if ((undefined1 *)local_1b0._0_8_ != local_1b0 + 0x10) goto LAB_0015df53;
    }
    p_Var6 = (_Base_ptr)&p_Var6->_M_parent;
  } while( true );
}

Assistant:

void TypedConfigurations::build(Configurations* configurations) {
  base::threading::ScopedLock scopedLock(lock());
  auto getBool = [] (std::string boolStr) -> bool {  // Pass by value for trimming
    base::utils::Str::trim(boolStr);
    return (boolStr == "TRUE" || boolStr == "true" || boolStr == "1");
  };
  std::vector<Configuration*> withFileSizeLimit;
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    // We cannot use switch on strong enums because Intel C++ dont support them yet
    if (conf->configurationType() == ConfigurationType::Enabled) {
      setValue(conf->level(), getBool(conf->value()), &m_enabledMap);
    } else if (conf->configurationType() == ConfigurationType::ToFile) {
      setValue(conf->level(), getBool(conf->value()), &m_toFileMap);
    } else if (conf->configurationType() == ConfigurationType::ToStandardOutput) {
      setValue(conf->level(), getBool(conf->value()), &m_toStandardOutputMap);
    } else if (conf->configurationType() == ConfigurationType::Filename) {
      // We do not yet configure filename but we will configure in another
      // loop. This is because if file cannot be created, we will force ToFile
      // to be false. Because configuring logger is not necessarily performance
      // sensative operation, we can live with another loop; (by the way this loop
      // is not very heavy either)
    } else if (conf->configurationType() == ConfigurationType::Format) {
      setValue(conf->level(), base::LogFormat(conf->level(),
                                              base::type::string_t(conf->value().begin(), conf->value().end())), &m_logFormatMap);
    } else if (conf->configurationType() == ConfigurationType::SubsecondPrecision) {
      setValue(Level::Global,
               base::SubsecondPrecision(static_cast<int>(getULong(conf->value()))), &m_subsecondPrecisionMap);
    } else if (conf->configurationType() == ConfigurationType::PerformanceTracking) {
      setValue(Level::Global, getBool(conf->value()), &m_performanceTrackingMap);
    } else if (conf->configurationType() == ConfigurationType::MaxLogFileSize) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_maxLogFileSizeMap);
#if !defined(ELPP_NO_DEFAULT_LOG_FILE)
      withFileSizeLimit.push_back(conf);
#endif  // !defined(ELPP_NO_DEFAULT_LOG_FILE)
    } else if (conf->configurationType() == ConfigurationType::LogFlushThreshold) {
      setValue(conf->level(), static_cast<std::size_t>(getULong(conf->value())), &m_logFlushThresholdMap);
    }
  }
  // As mentioned earlier, we will now set filename configuration in separate loop to deal with non-existent files
  for (Configurations::const_iterator it = configurations->begin(); it != configurations->end(); ++it) {
    Configuration* conf = *it;
    if (conf->configurationType() == ConfigurationType::Filename) {
      insertFile(conf->level(), conf->value());
    }
  }
  for (std::vector<Configuration*>::iterator conf = withFileSizeLimit.begin();
       conf != withFileSizeLimit.end(); ++conf) {
    // This is not unsafe as mutex is locked in currect scope
    unsafeValidateFileRolling((*conf)->level(), base::defaultPreRollOutCallback);
  }
}